

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall xray_re::cse_smart_cover::cse_smart_cover(cse_smart_cover *this)

{
  allocator<char> local_1d [13];
  cse_smart_cover *local_10;
  cse_smart_cover *this_local;
  
  local_10 = this;
  cse_shape::cse_shape(&this->super_cse_shape);
  cse_alife_dynamic_object::cse_alife_dynamic_object(&this->super_cse_alife_dynamic_object);
  (this->super_cse_shape)._vptr_cse_shape = (_func_int **)&PTR__cse_smart_cover_00389a88;
  (this->super_cse_alife_dynamic_object).super_cse_alife_object.super_cse_abstract.
  _vptr_cse_abstract = (_func_int **)&PTR__cse_smart_cover_00389ad0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_cs_unk1_sz,"",local_1d);
  std::allocator<char>::~allocator(local_1d);
  this->m_cs_unk2_float = 0.0;
  this->m_enter_min_enemy_distance = 15.0;
  this->m_exit_min_enemy_distance = 10.0;
  this->m_is_combat_cover = true;
  this->m_cs_unk3_u8 = '\0';
  return;
}

Assistant:

cse_smart_cover::cse_smart_cover():
	m_cs_unk1_sz(""), m_cs_unk2_float(0.f),
	m_enter_min_enemy_distance(15.f), m_exit_min_enemy_distance(10.f),
	m_is_combat_cover(true), m_cs_unk3_u8(0) {}